

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O3

void zmq::set_ip_type_of_service(fd_t s_,int iptos_)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int local_c;
  
  local_c = iptos_;
  iVar2 = setsockopt(s_,0,1,&local_c,4);
  if (iVar2 != 0) {
    set_ip_type_of_service();
  }
  iVar2 = setsockopt(s_,0x29,0x43,&local_c,4);
  if (iVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    if ((uVar1 != 0x16) && (uVar1 != 0x5c)) {
      set_ip_type_of_service((zmq *)(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void zmq::set_ip_type_of_service (fd_t s_, int iptos_)
{
    int rc = setsockopt (s_, IPPROTO_IP, IP_TOS,
                         reinterpret_cast<char *> (&iptos_), sizeof (iptos_));

#ifdef ZMQ_HAVE_WINDOWS
    wsa_assert (rc != SOCKET_ERROR);
#else
    errno_assert (rc == 0);
#endif

    //  Windows and Hurd do not support IPV6_TCLASS
#if !defined(ZMQ_HAVE_WINDOWS) && defined(IPV6_TCLASS)
    rc = setsockopt (s_, IPPROTO_IPV6, IPV6_TCLASS,
                     reinterpret_cast<char *> (&iptos_), sizeof (iptos_));

    //  If IPv6 is not enabled ENOPROTOOPT will be returned on Linux and
    //  EINVAL on OSX
    if (rc == -1) {
        errno_assert (errno == ENOPROTOOPT || errno == EINVAL);
    }
#endif
}